

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O2

void __thiscall
Qentem::BigInt<unsigned_char,_128U>::Add
          (BigInt<unsigned_char,_128U> *this,uchar number,SizeT32 index)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  undefined3 in_register_00000031;
  int iVar5;
  
  iVar5 = CONCAT31(in_register_00000031,number);
  if (iVar5 != 0) {
    uVar2 = (ulong)index;
    uVar3 = index - 1;
    do {
      if (0xf < uVar2) {
        this->index_ = 0;
        return;
      }
      bVar1 = this->storage_[uVar2];
      uVar3 = uVar3 + 1;
      bVar4 = (char)iVar5 + bVar1;
      this->storage_[uVar2] = bVar4;
      uVar2 = uVar2 + 1;
      iVar5 = 1;
    } while (bVar4 <= bVar1);
    if (this->index_ < uVar3) {
      this->index_ = uVar3;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }